

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O0

Ref __thiscall wasm::Wasm2JSBuilder::processWasm(Wasm2JSBuilder *this,Module *wasm,Name funcName)

{
  anon_class_24_3_0025a3ee visitor;
  variant<wasm::Name,_wasm::HeapType> value;
  anon_class_32_4_0688565d visitor_00;
  IString str;
  IString str_00;
  IString str_01;
  undefined1 auVar1 [16];
  Ref left;
  size_t sVar2;
  bool bVar3;
  reference this_00;
  pointer pEVar4;
  Name *__x;
  Ref RVar5;
  reference this_01;
  pointer __k;
  mapped_type *pmVar6;
  long lVar7;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *pvVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  ostream *poVar10;
  Ref *pRVar11;
  Value *pVVar12;
  reference pvVar13;
  pointer pMVar14;
  type pMVar15;
  pointer pFVar16;
  GlobalGet *value_00;
  Function *func_00;
  Export *this_02;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  Ref in_R8;
  IString arg;
  IString name;
  IString name_00;
  IString op;
  IString name_01;
  anon_class_16_2_a3c67e8c visitor_01;
  anon_class_16_2_a3c67e8c visitor_02;
  anon_class_16_2_a3c67e8c visitor_03;
  IString op_00;
  IString name_02;
  IString name_03;
  IString name_04;
  IString name_05;
  IString name_06;
  IString name_07;
  IString name_08;
  IString name_09;
  IString name_10;
  IString name_11;
  IString name_12;
  IString name_13;
  IString name_14;
  Name name_15;
  IString local_1220;
  Ref local_1210;
  Value *local_1208;
  ValueBuilder *local_1200;
  size_t local_11f8;
  Value *local_11f0;
  Ref local_11e8;
  size_t local_11e0;
  IString local_11d8;
  Value *local_11c8;
  Value *local_11c0;
  IString local_11b8;
  Value *local_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 local_1190;
  undefined8 local_1188;
  undefined8 uStack_1180;
  string_view local_1170;
  Type local_1160;
  size_t local_1158;
  char *pcStack_1150;
  string_view local_1148;
  pointer local_1138;
  anon_union_16_6_a0c44491_for_Value_2 aStack_1130;
  Type local_1120;
  Type local_1118;
  Signature local_1110;
  HeapType local_1100 [3];
  Name local_10e8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_10d8;
  Value *local_10d0;
  Builder local_10c8;
  Builder builder;
  IString local_10a8;
  Value *local_1098;
  Wasm2JSBuilder *local_1090;
  undefined1 *local_1088;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  **local_1080;
  bool *local_1078;
  bool local_1069;
  undefined1 auStack_1068 [7];
  bool generateFetchHighBits;
  size_t local_1058;
  char *local_1050;
  reference local_1048;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *f;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range1_1;
  IString local_fe8;
  Ref local_fd8;
  Value *local_fd0;
  Value *local_fc8;
  Ref local_fc0;
  size_t local_fb8;
  Value *local_fb0;
  Value *local_fa8;
  Ref local_fa0;
  Ref theVar_1;
  IString local_f70;
  Value *local_f60;
  IString local_f58;
  Ref local_f48;
  Value *local_f40;
  Value *local_f38;
  Value *local_f30;
  IString local_f28;
  Value *local_f18;
  IString local_f10;
  Ref local_f00;
  Value *local_ef8;
  Ref local_ef0;
  size_t local_ee8;
  Value *local_ee0;
  Value *local_ed8;
  Ref local_ed0;
  Ref buf;
  IString local_ec0;
  Value *local_eb0;
  Value *local_ea8;
  Ref local_ea0;
  Ref theVar;
  undefined1 local_e60 [8];
  Ref asmFunc;
  WasmValidator local_cc9;
  __node_base local_cc8;
  __node_base _Stack_cc0;
  reference local_cb0;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  undefined1 local_c88 [4];
  Index i_1;
  Output out;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_970;
  allocator<char> local_941;
  string local_940;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_918;
  allocator<char> local_8e9;
  string local_8e8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8c0;
  allocator<char> local_891;
  string local_890;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_868;
  allocator<char> local_839;
  string local_838;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_810;
  allocator<char> local_7e1;
  string local_7e0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b8;
  allocator<char> local_789;
  string local_788;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_760;
  allocator<char> local_731;
  string local_730;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_708;
  allocator<char> local_6d9;
  string local_6d8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b0;
  allocator<char> local_681;
  string local_680;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_658;
  allocator<char> local_629;
  string local_628;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  allocator<char> local_5d1;
  string local_5d0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5a8;
  allocator<char> local_579;
  string local_578;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  allocator<char> local_521;
  string local_520;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  allocator<char> local_4c9;
  string local_4c8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  allocator<char> local_471;
  string local_470;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_448;
  allocator<char> local_419;
  string local_418;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  allocator<char> local_3c1;
  string local_3c0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398;
  allocator<char> local_369;
  string local_368;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  allocator<char> local_311;
  string local_310;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e8;
  allocator<char> local_2b9;
  string local_2b8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_290;
  allocator<char> local_261;
  string local_260;
  PassOptions local_230;
  undefined1 local_178 [8];
  PassRunner runner;
  uint local_6c;
  Index i;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  Module *wasm_local;
  Wasm2JSBuilder *this_local;
  Name funcName_local;
  Ref ret;
  
  funcName_local.super_IString.str._M_len = funcName.super_IString.str._M_str;
  this_local = funcName.super_IString.str._M_len;
  __range1 = &wasm->exports;
  wasm_local = (Module *)this;
  __end1 = std::
           vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ::begin(&wasm->exports);
  exp = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
        std::
        vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
        ::end(&wasm->exports);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                     *)&exp), bVar3) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
              ::operator*(&__end1);
    pEVar4 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->(this_00);
    if (pEVar4->kind == Function) {
      pEVar4 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                         (this_00);
      __x = Export::getInternalName(pEVar4);
      std::
      unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
      ::insert(&this->functionsCallableFromOutside,__x);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
    ::operator++(&__end1);
  }
  ElementUtils::
  iterAllElementFunctionNames<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__0>
            ((Module *)__range1,(anon_class_8_1_8991fb9c)this);
  for (local_6c = 0;
      RVar5.inst = (Value *)std::
                            vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                            ::size((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                                    *)(__range1 + 6)), pvVar8 = __range1,
      (Value *)(ulong)local_6c < RVar5.inst; local_6c = local_6c + 1) {
    this_01 = std::
              vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                            *)(__range1 + 6),(ulong)local_6c);
    __k = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                    (this_01);
    pmVar6 = std::
             unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
             ::operator[](&this->dataIndices,(key_type *)__k);
    *pmVar6 = local_6c;
  }
  runner.isNested = false;
  runner.addedPassesRemovedDWARF = false;
  runner._234_6_ = 0;
  IString::IString((IString *)&runner.isNested);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = RVar5.inst;
  ABI::wasm2js::ensureHelpers((wasm2js *)pvVar8,(Module *)runner._232_8_,(IString)(auVar1 << 0x40));
  pvVar8 = __range1;
  PassOptions::PassOptions(&local_230,&this->options);
  PassRunner::PassRunner((PassRunner *)local_178,(Module *)pvVar8,&local_230);
  PassOptions::~PassOptions(&local_230);
  if (((this->flags).emscripten & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"llvm-nontrapping-fptoint-lowering",&local_261);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_260,&local_290);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_290);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator(&local_261);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"legalize-js-interface",&local_2b9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_2b8,&local_2e8);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_2e8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  if (0 < (this->options).optimizeLevel) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"optimize-for-js",&local_311);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_310,&local_340);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_340);
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_368,"remove-non-js-ops",&local_369);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_368,&local_398);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_398);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,"flatten",&local_3c1);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_3c0,&local_3f0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_3f0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"i64-to-i32-lowering",&local_419);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_418,&local_448);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_448);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"alignment-lowering",&local_471);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_470,&local_4a0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_4a0);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  if (0 < (this->options).optimizeLevel) {
    if ((2 < (this->options).optimizeLevel) || (0 < (this->options).shrinkLevel)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4c8,"simplify-locals-nonesting",&local_4c9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_178,&local_4c8,&local_4f8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_4f8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_520,"precompute-propagate",&local_521);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_178,&local_520,&local_550);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_550);
      std::__cxx11::string::~string((string *)&local_520);
      std::allocator<char>::~allocator(&local_521);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_578,"avoid-reinterprets",&local_579);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_178,&local_578,&local_5a8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_5a8);
      std::__cxx11::string::~string((string *)&local_578);
      std::allocator<char>::~allocator(&local_579);
    }
    PassRunner::addDefaultOptimizationPasses((PassRunner *)local_178);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5d0,"avoid-reinterprets",&local_5d1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_5d0,&local_600);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_600);
    std::__cxx11::string::~string((string *)&local_5d0);
    std::allocator<char>::~allocator(&local_5d1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_628,"flatten",&local_629);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_628,&local_658);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_658);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_680,"simplify-locals-notee-nostructure",&local_681);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_680,&local_6b0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_6b0);
  std::__cxx11::string::~string((string *)&local_680);
  std::allocator<char>::~allocator(&local_681);
  if (0 < (this->options).optimizeLevel) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6d8,"remove-unused-names",&local_6d9);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_6d8,&local_708);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_708);
    std::__cxx11::string::~string((string *)&local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_730,"merge-blocks",&local_731);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_730,&local_760);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_760);
    std::__cxx11::string::~string((string *)&local_730);
    std::allocator<char>::~allocator(&local_731);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"reorder-locals",&local_789);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_788,&local_7b8);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_7b8);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"coalesce-locals",&local_7e1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_178,&local_7e0,&local_810);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_810);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_838,"reorder-locals",&local_839);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_838,&local_868);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_868);
  std::__cxx11::string::~string((string *)&local_838);
  std::allocator<char>::~allocator(&local_839);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_890,"vacuum",&local_891);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_890,&local_8c0);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_8c0);
  std::__cxx11::string::~string((string *)&local_890);
  std::allocator<char>::~allocator(&local_891);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8e8,"remove-unused-module-elements",&local_8e9);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_8e8,&local_918);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_918);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_940,"dce",&local_941);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional();
  PassRunner::add((PassRunner *)local_178,&local_940,&local_970);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_970);
  std::__cxx11::string::~string((string *)&local_940);
  std::allocator<char>::~allocator(&local_941);
  PassRunner::setDebug((PassRunner *)local_178,(bool)((this->flags).debug & 1));
  PassRunner::run((PassRunner *)local_178);
  PassRunner::~PassRunner((PassRunner *)local_178);
  lVar7 = std::__cxx11::string::size();
  if (lVar7 != 0) {
    Output::Output((Output *)local_c88,&(this->flags).symbolsFile,Text);
    __range2._4_4_ = 0;
    pvVar8 = __range1 + 1;
    __end2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      *)pvVar8);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                  *)pvVar8);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                       *)&func), bVar3) {
      local_cb0 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end2);
      poVar10 = Output::getStream((Output *)local_c88);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,__range2._4_4_);
      poVar10 = std::operator<<(poVar10,':');
      pFVar16 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          (local_cb0);
      local_cc8._M_nxt =
           (_Hash_node_base *)(pFVar16->super_Importable).super_Named.name.super_IString.str._M_len;
      _Stack_cc0._M_nxt =
           (_Hash_node_base *)(pFVar16->super_Importable).super_Named.name.super_IString.str._M_str;
      pbVar9 = std::operator<<(poVar10,(pFVar16->super_Importable).super_Named.name.super_IString.
                                       str);
      std::operator<<(pbVar9,'\n');
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end2);
      __range2._4_4_ = __range2._4_4_ + 1;
    }
    Output::~Output((Output *)local_c88);
  }
  bVar3 = WasmValidator::validate(&local_cc9,(Module *)__range1,2);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    poVar10 = std::operator<<((ostream *)&std::cout,(Module *)__range1);
    std::operator<<(poVar10,'\n');
    Fatal::Fatal((Fatal *)&asmFunc);
    Fatal::operator<<((Fatal *)&asmFunc,(char (*) [35])"error in validating wasm2js output");
    Fatal::~Fatal((Fatal *)&asmFunc);
  }
  funcName_local.super_IString.str._M_str = (char *)cashew::ValueBuilder::makeToplevel();
  name_02.str._M_str = extraout_RDX;
  name_02.str._M_len = funcName_local.super_IString.str._M_len;
  local_e60 = (undefined1  [8])
              cashew::ValueBuilder::makeFunction((ValueBuilder *)this_local,name_02);
  pRVar11 = cashew::Ref::operator[]((Ref *)&funcName_local.super_IString.str._M_str,1);
  pVVar12 = cashew::Ref::operator->(pRVar11);
  cashew::Value::push_back(pVVar12,(Ref)local_e60);
  arg.str._M_str = (char *)RVar5.inst;
  arg.str._M_len = DAT_03194480;
  cashew::ValueBuilder::appendArgumentToFunction((ValueBuilder *)local_e60,importObject,arg);
  bVar3 = std::
          vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
          ::empty((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                   *)(__range1 + 5));
  if (!bVar3) {
    pvVar13 = std::
              vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
              ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                            *)(__range1 + 5),0);
    pMVar14 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar13)
    ;
    bVar3 = Importable::imported(&pMVar14->super_Importable);
    if (bVar3) {
      pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
      theVar.inst = pRVar11->inst;
      pvVar13 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(__range1 + 5),0);
      pMVar15 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator*
                          (pvVar13);
      ensureModuleVar(this,theVar,&pMVar15->super_Importable);
      local_ea0 = cashew::ValueBuilder::makeVar(false);
      pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
      pVVar12 = cashew::Ref::operator->(pRVar11);
      local_ea8 = local_ea0.inst;
      cashew::Value::push_back(pVVar12,local_ea0);
      local_eb0 = local_ea0.inst;
      IString::IString(&local_ec0,"memory");
      pvVar13 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(__range1 + 5),0);
      pMVar15 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator*
                          (pvVar13);
      buf = getImportName(this,&pMVar15->super_Importable);
      name.str._M_str = (char *)buf.inst;
      name.str._M_len = (size_t)local_ec0.str._M_str;
      cashew::ValueBuilder::appendToVar
                ((ValueBuilder *)local_eb0,(Ref)local_ec0.str._M_len,name,in_R8);
      local_ed0 = cashew::ValueBuilder::makeVar(false);
      pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
      pVVar12 = cashew::Ref::operator->(pRVar11);
      local_ed8 = local_ed0.inst;
      cashew::Value::push_back(pVVar12,local_ed0);
      local_ee0 = local_ed0.inst;
      local_ef0.inst = BUFFER;
      local_ee8 = DAT_03192b18;
      IString::IString(&local_f10,"memory");
      name_03.str._M_str = extraout_RDX_00;
      name_03.str._M_len = (size_t)local_f10.str._M_str;
      local_f00 = cashew::ValueBuilder::makeName((ValueBuilder *)local_f10.str._M_len,name_03);
      IString::IString(&local_f28,"buffer");
      name_04.str._M_str = extraout_RDX_01;
      name_04.str._M_len = (size_t)local_f28.str._M_str;
      local_f18 = (Value *)cashew::ValueBuilder::makeName
                                     ((ValueBuilder *)local_f28.str._M_len,name_04);
      local_ef8 = (Value *)cashew::ValueBuilder::makeDot(local_f00,(Ref)local_f18);
      name_00.str._M_str = (char *)local_ef8;
      name_00.str._M_len = local_ee8;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)local_ee0,local_ef0,name_00,in_R8);
      pvVar13 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(__range1 + 5),0);
      pMVar14 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar13);
      pVVar12 = (Value *)wasm::Address::operator_cast_to_unsigned_long(&pMVar14->max);
      pvVar13 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(__range1 + 5),0);
      pMVar14 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar13);
      RVar5.inst = (Value *)wasm::Address::operator_cast_to_unsigned_long(&pMVar14->initial);
      if (RVar5.inst < pVVar12) {
        pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
        pVVar12 = cashew::Ref::operator->(pRVar11);
        IString::IString(&local_f58,"memory");
        name_05.str._M_str = extraout_RDX_02;
        name_05.str._M_len = (size_t)local_f58.str._M_str;
        local_f48 = cashew::ValueBuilder::makeName((ValueBuilder *)local_f58.str._M_len,name_05);
        IString::IString(&local_f70,"grow");
        name_06.str._M_str = extraout_RDX_03;
        name_06.str._M_len = (size_t)local_f70.str._M_str;
        local_f60 = (Value *)cashew::ValueBuilder::makeName
                                       ((ValueBuilder *)local_f70.str._M_len,name_06);
        local_f40 = (Value *)cashew::ValueBuilder::makeDot(local_f48,(Ref)local_f60);
        sVar2 = DAT_03193440;
        left.inst = cashew::SET.inst;
        theVar_1.inst = WASM_MEMORY_GROW;
        name_07.str._M_str = extraout_RDX_04;
        name_07.str._M_len = DAT_03192ca8;
        RVar5 = cashew::ValueBuilder::makeName(WASM_MEMORY_GROW,name_07);
        op.str._M_str = (char *)RVar5.inst;
        op.str._M_len = sVar2;
        local_f38 = (Value *)cashew::ValueBuilder::makeBinary
                                       ((ValueBuilder *)local_f40,left,op,in_R8);
        local_f30 = (Value *)cashew::ValueBuilder::makeStatement((Ref)local_f38);
        cashew::Value::push_back(pVVar12,(Ref)local_f30);
      }
    }
    else {
      local_fa0 = cashew::ValueBuilder::makeVar(false);
      pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
      pVVar12 = cashew::Ref::operator->(pRVar11);
      local_fa8 = local_fa0.inst;
      cashew::Value::push_back(pVVar12,local_fa0);
      local_fb0 = local_fa0.inst;
      local_fc0.inst = BUFFER;
      local_fb8 = DAT_03192b18;
      IString::IString(&local_fe8,"ArrayBuffer");
      name_08.str._M_str = extraout_RDX_05;
      name_08.str._M_len = (size_t)local_fe8.str._M_str;
      local_fd8 = cashew::ValueBuilder::makeName((ValueBuilder *)local_fe8.str._M_len,name_08);
      pvVar13 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                              *)(__range1 + 5),0);
      pMVar14 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                          (pvVar13);
      RVar5 = cashew::ValueBuilder::makeInt((uint32_t)((pMVar14->initial).addr << 0x10));
      local_fd0 = (Value *)cashew::ValueBuilder::makeCall(local_fd8,RVar5);
      RVar5 = cashew::ValueBuilder::makeNew((Ref)local_fd0);
      name_01.str._M_str = (char *)RVar5.inst;
      name_01.str._M_len = local_fb8;
      local_fc8 = RVar5.inst;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)local_fb0,local_fc0,name_01,in_R8);
    }
  }
  visitor_01.asmFunc = (Ref *)RVar5.inst;
  visitor_01.this = (Wasm2JSBuilder *)local_e60;
  wasm::ModuleUtils::
  iterImportedTables<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__1>
            ((ModuleUtils *)__range1,(Module *)this,visitor_01);
  pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
  addBasics(this,pRVar11->inst,(Module *)__range1);
  visitor_02.asmFunc = (Ref *)RVar5.inst;
  visitor_02.this = (Wasm2JSBuilder *)local_e60;
  wasm::ModuleUtils::
  iterImportedFunctions<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__2>
            ((ModuleUtils *)__range1,(Module *)this,visitor_02);
  visitor_03.asmFunc = (Ref *)RVar5.inst;
  visitor_03.this = (Wasm2JSBuilder *)local_e60;
  wasm::ModuleUtils::
  iterImportedGlobals<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__3>
            ((ModuleUtils *)__range1,(Module *)this,visitor_03);
  pvVar8 = __range1 + 1;
  __end1_1 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      *)pvVar8);
  f = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
      std::
      vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
      ::end((vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             *)pvVar8);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                             *)&f), bVar3) {
    local_1048 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                 ::operator*(&__end1_1);
    pFVar16 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (local_1048);
    local_1058 = (pFVar16->super_Importable).super_Named.name.super_IString.str._M_len;
    local_1050 = (pFVar16->super_Importable).super_Named.name.super_IString.str._M_str;
    _auStack_1068 =
         (string_view)
         fromName(this,(Name)(pFVar16->super_Importable).super_Named.name.super_IString.str,Top);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end1_1);
  }
  local_1069 = false;
  local_1088 = local_e60;
  local_1080 = &__range1;
  local_1078 = &local_1069;
  visitor_00.asmFunc = (Ref *)local_1088;
  visitor_00.this = this;
  visitor_00.wasm = (Module **)local_1080;
  visitor_00.generateFetchHighBits = local_1078;
  local_1090 = this;
  wasm::ModuleUtils::
  iterDefinedGlobals<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__4>
            ((Module *)__range1,visitor_00);
  if (((this->flags).emscripten & 1U) != 0) {
    pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
    pVVar12 = cashew::Ref::operator->(pRVar11);
    IString::IString(&local_10a8,"// EMSCRIPTEN_START_FUNCS\n");
    name_09.str._M_str = extraout_RDX_06;
    name_09.str._M_len = (size_t)local_10a8.str._M_str;
    local_1098 = (Value *)cashew::ValueBuilder::makeName
                                    ((ValueBuilder *)local_10a8.str._M_len,name_09);
    cashew::Value::push_back(pVVar12,(Ref)local_1098);
  }
  builder.wasm = (Module *)local_e60;
  visitor.this = this;
  visitor.asmFunc = (Ref *)builder.wasm;
  visitor.wasm = (Module **)&__range1;
  wasm::ModuleUtils::
  iterDefinedFunctions<wasm::Wasm2JSBuilder::processWasm(wasm::Module*,wasm::Name)::__5>
            ((Module *)__range1,visitor);
  if ((local_1069 & 1U) != 0) {
    Builder::Builder(&local_10c8,(Module *)__range1);
    pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
    pVVar12 = cashew::Ref::operator->(pRVar11);
    pvVar8 = __range1;
    local_1100[1].id = WASM_FETCH_HIGH_BITS._0_8_;
    local_1100[2].id = WASM_FETCH_HIGH_BITS._8_8_;
    str_01.str._M_str = (char *)WASM_FETCH_HIGH_BITS._8_8_;
    str_01.str._M_len = WASM_FETCH_HIGH_BITS._0_8_;
    wasm::Name::Name(&local_10e8,str_01);
    wasm::Type::Type(&local_1118,none);
    wasm::Type::Type(&local_1120,i32);
    Signature::Signature(&local_1110,local_1118,local_1120);
    HeapType::HeapType(local_1100,local_1110);
    local_1138 = (pointer)0x0;
    aStack_1130.str.str._M_len = 0;
    aStack_1130.str.str._M_str = (char *)0x0;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_1138);
    local_1158 = INT64_TO_32_HIGH_BITS;
    pcStack_1150 = DAT_03192cd8;
    str_00.str._M_str = DAT_03192cd8;
    str_00.str._M_len = INT64_TO_32_HIGH_BITS;
    wasm::Name::Name((Name *)&local_1148,str_00);
    wasm::Type::Type(&local_1160,i32);
    value_00 = Builder::makeGlobalGet(&local_10c8,(Name)local_1148,local_1160);
    Builder::makeReturn(&local_10c8,(Expression *)value_00);
    in_R8.inst = (Value *)&local_1138;
    name_15.super_IString.str._M_str = (char *)local_10e8.super_IString.str._M_len;
    name_15.super_IString.str._M_len = (size_t)&local_10d8;
    Builder::makeFunction
              (name_15,(HeapType)local_10e8.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_1100[0].id,
               (Expression *)in_R8.inst);
    func_00 = Module::addFunction((Module *)pvVar8,&local_10d8);
    local_10d0 = (Value *)processFunction(this,(Module *)pvVar8,func_00,false);
    cashew::Value::push_back(pVVar12,(Ref)local_10d0);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_10d8);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&local_1138);
    pvVar8 = __range1;
    this_02 = (Export *)operator_new(0x30);
    local_1188 = WASM_FETCH_HIGH_BITS._0_8_;
    uStack_1180 = WASM_FETCH_HIGH_BITS._8_8_;
    str.str._M_str = (char *)WASM_FETCH_HIGH_BITS._8_8_;
    str.str._M_len = WASM_FETCH_HIGH_BITS._0_8_;
    wasm::Name::Name((Name *)&local_1170,str);
    std::variant<wasm::Name,wasm::HeapType>::variant<wasm::IString&,void,void,wasm::Name,void>
              ((variant<wasm::Name,wasm::HeapType> *)&local_11a0,(IString *)WASM_FETCH_HIGH_BITS);
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_str = (char *)uStack_1198;
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.super_IString.
    str._M_len = local_11a0;
    value.super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_1190;
    Export::Export(this_02,(Name)local_1170,Function,value);
    Module::addExport((Module *)pvVar8,this_02);
  }
  if (((this->flags).emscripten & 1U) != 0) {
    pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
    pVVar12 = cashew::Ref::operator->(pRVar11);
    IString::IString(&local_11b8,"// EMSCRIPTEN_END_FUNCS\n");
    name_10.str._M_str = extraout_RDX_07;
    name_10.str._M_len = (size_t)local_11b8.str._M_str;
    local_11a8 = (Value *)cashew::ValueBuilder::makeName
                                    ((ValueBuilder *)local_11b8.str._M_len,name_10);
    cashew::Value::push_back(pVVar12,(Ref)local_11a8);
  }
  bVar3 = needsBufferView((Module *)__range1);
  if (bVar3) {
    pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
    pVVar12 = cashew::Ref::operator->(pRVar11);
    IString::IString(&local_11d8,"bufferView");
    name_11.str._M_str = extraout_RDX_08;
    name_11.str._M_len = (size_t)local_11d8.str._M_str;
    local_11c8 = (Value *)cashew::ValueBuilder::makeName
                                    ((ValueBuilder *)local_11d8.str._M_len,name_11);
    local_11e8.inst = cashew::SET.inst;
    local_11e0 = DAT_03193440;
    local_1200 = cashew::HEAPU8;
    local_11f8 = DAT_031932e0;
    name_12.str._M_str = extraout_RDX_09;
    name_12.str._M_len = DAT_031932e0;
    local_11f0 = (Value *)cashew::ValueBuilder::makeName(cashew::HEAPU8,name_12);
    op_00.str._M_str = (char *)local_11f0;
    op_00.str._M_len = local_11e0;
    local_11c0 = (Value *)cashew::ValueBuilder::makeBinary
                                    ((ValueBuilder *)local_11c8,local_11e8,op_00,in_R8);
    cashew::Value::push_back(pVVar12,(Ref)local_11c0);
  }
  bVar3 = hasActiveSegments((Module *)__range1);
  if (bVar3) {
    pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
    pVVar12 = cashew::Ref::operator->(pRVar11);
    IString::IString(&local_1220,"initActiveSegments");
    name_13.str._M_str = extraout_RDX_10;
    name_13.str._M_len = (size_t)local_1220.str._M_str;
    local_1210 = cashew::ValueBuilder::makeName((ValueBuilder *)local_1220.str._M_len,name_13);
    name_14.str._M_str = extraout_RDX_11;
    name_14.str._M_len = DAT_03194480;
    RVar5 = cashew::ValueBuilder::makeName(importObject.inst,name_14);
    local_1208 = (Value *)cashew::ValueBuilder::makeCall(local_1210,RVar5);
    cashew::Value::push_back(pVVar12,(Ref)local_1208);
  }
  pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
  addTable(this,pRVar11->inst,(Module *)__range1);
  pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
  addStart(this,pRVar11->inst,(Module *)__range1);
  pRVar11 = cashew::Ref::operator[]((Ref *)local_e60,3);
  addExports(this,pRVar11->inst,(Module *)__range1);
  return (Ref)(Value *)funcName_local.super_IString.str._M_str;
}

Assistant:

Ref Wasm2JSBuilder::processWasm(Module* wasm, Name funcName) {
  // Scan the wasm for important things.
  for (auto& exp : wasm->exports) {
    if (exp->kind == ExternalKind::Function) {
      functionsCallableFromOutside.insert(*exp->getInternalName());
    }
  }
  ElementUtils::iterAllElementFunctionNames(
    wasm, [&](Name name) { functionsCallableFromOutside.insert(name); });

  // Collect passive data segment indices.
  for (Index i = 0; i < wasm->dataSegments.size(); ++i) {
    dataIndices[wasm->dataSegments[i]->name] = i;
  }

  // Ensure the scratch memory helpers.
  // If later on they aren't needed, we'll clean them up.
  ABI::wasm2js::ensureHelpers(wasm);

  // Process the code, and optimize if relevant.
  // First, do the lowering to a JS-friendly subset.
  {
    PassRunner runner(wasm, options);
    if (flags.emscripten) {
      runner.add("llvm-nontrapping-fptoint-lowering");
    }
    // TODO: only legalize if necessary - emscripten would already do so, and
    //       likely other toolchains. but spec test suite needs that.
    runner.add("legalize-js-interface");
    // Before lowering non-JS operations we can optimize some instructions which
    // may simplify next passes
    if (options.optimizeLevel > 0) {
      runner.add("optimize-for-js");
    }
    // First up remove as many non-JS operations we can, including things like
    // 64-bit integer multiplication/division, `f32.nearest` instructions, etc.
    // This may inject intrinsics which use i64 so it needs to be run before the
    // i64-to-i32 lowering pass.
    runner.add("remove-non-js-ops");
    // Currently the i64-to-32 lowering pass requires that `flatten` be run
    // before it to produce correct code. For some more details about this see
    // #1480
    runner.add("flatten");
    runner.add("i64-to-i32-lowering");
    runner.add("alignment-lowering");
    // Next, optimize that as best we can. This should not generate
    // non-JS-friendly things.
    if (options.optimizeLevel > 0) {
      // It is especially import to propagate constants after the lowering.
      // However, this can be a slow operation, especially after flattening;
      // some local simplification helps.
      if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
        runner.add("simplify-locals-nonesting");
        runner.add("precompute-propagate");
        // Avoiding reinterpretation is helped by propagation. We also run
        // it later down as default optimizations help as well.
        runner.add("avoid-reinterprets");
      }
      runner.addDefaultOptimizationPasses();
      runner.add("avoid-reinterprets");
    }
    // Finally, get the code into the flat form we need for wasm2js itself, and
    // optimize that a little in a way that keeps that property.
    runner.add("flatten");
    // Regardless of optimization level, run some simple optimizations to undo
    // some of the effects of flattening.
    runner.add("simplify-locals-notee-nostructure");
    // Some operations can be very slow if we didn't run full optimizations
    // earlier, so don't run them automatically.
    if (options.optimizeLevel > 0) {
      runner.add("remove-unused-names");
      runner.add("merge-blocks");
      runner.add("reorder-locals");
      runner.add("coalesce-locals");
    }
    runner.add("reorder-locals");
    runner.add("vacuum");
    runner.add("remove-unused-module-elements");
    // DCE at the end to make sure all IR nodes have valid types for conversion
    // to JS, and not unreachable.
    runner.add("dce");
    runner.setDebug(flags.debug);
    runner.run();
  }

  if (flags.symbolsFile.size() > 0) {
    Output out(flags.symbolsFile, wasm::Flags::Text);
    Index i = 0;
    for (auto& func : wasm->functions) {
      out.getStream() << i++ << ':' << func->name.str << '\n';
    }
  }

#ifndef NDEBUG
  if (!WasmValidator().validate(*wasm)) {
    std::cout << *wasm << '\n';
    Fatal() << "error in validating wasm2js output";
  }
#endif

  Ref ret = ValueBuilder::makeToplevel();
  Ref asmFunc = ValueBuilder::makeFunction(funcName);
  ret[1]->push_back(asmFunc);
  ValueBuilder::appendArgumentToFunction(asmFunc, importObject);

  // add memory import
  if (!wasm->memories.empty()) {
    if (wasm->memories[0]->imported()) {
      ensureModuleVar(asmFunc[3], *wasm->memories[0]);

      // find memory and buffer in imports
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar, "memory", getImportName(*wasm->memories[0]));

      // Assign `buffer = memory.buffer`
      Ref buf = ValueBuilder::makeVar();
      asmFunc[3]->push_back(buf);
      ValueBuilder::appendToVar(
        buf,
        BUFFER,
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName("buffer")));

      // If memory is growable, override the imported memory's grow method to
      // ensure so that when grow is called from the output it works as expected
      if (wasm->memories[0]->max > wasm->memories[0]->initial) {
        asmFunc[3]->push_back(
          ValueBuilder::makeStatement(ValueBuilder::makeBinary(
            ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                                  ValueBuilder::makeName("grow")),
            SET,
            ValueBuilder::makeName(WASM_MEMORY_GROW))));
      }
    } else {
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar,
        BUFFER,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName("ArrayBuffer"),
          ValueBuilder::makeInt(Address::address32_t(
            wasm->memories[0]->initial.addr * Memory::kPageSize)))));
    }
  }

  // add imported tables
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    ensureModuleVar(asmFunc[3], *table);
    Ref theVar = ValueBuilder::makeVar();
    asmFunc[3]->push_back(theVar);
    ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, getImportName(*table));
  });

  // create heaps, etc
  addBasics(asmFunc[3], wasm);
  ModuleUtils::iterImportedFunctions(
    *wasm, [&](Function* import) { addFunctionImport(asmFunc[3], import); });
  ModuleUtils::iterImportedGlobals(
    *wasm, [&](Global* import) { addGlobalImport(asmFunc[3], import); });

  // Note the names of functions. We need to do this here as when generating
  // mangled local names we need them not to conflict with these (see fromName)
  // so we can't wait until we parse each function to note its name.
  for (auto& f : wasm->functions) {
    fromName(f->name, NameScope::Top);
  }

  // globals
  bool generateFetchHighBits = false;
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    addGlobal(asmFunc[3], global, wasm);
    if (flags.allowAsserts && global->name == INT64_TO_32_HIGH_BITS) {
      generateFetchHighBits = true;
    }
  });
  if (flags.emscripten) {
    asmFunc[3]->push_back(
      ValueBuilder::makeName("// EMSCRIPTEN_START_FUNCS\n"));
  }
  // functions
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    asmFunc[3]->push_back(processFunction(wasm, func));
  });
  if (generateFetchHighBits) {
    Builder builder(*wasm);
    asmFunc[3]->push_back(
      processFunction(wasm,
                      wasm->addFunction(builder.makeFunction(
                        WASM_FETCH_HIGH_BITS,
                        Signature(Type::none, Type::i32),
                        {},
                        builder.makeReturn(builder.makeGlobalGet(
                          INT64_TO_32_HIGH_BITS, Type::i32))))));
    wasm->addExport(new Export(
      WASM_FETCH_HIGH_BITS, ExternalKind::Function, WASM_FETCH_HIGH_BITS));
  }
  if (flags.emscripten) {
    asmFunc[3]->push_back(ValueBuilder::makeName("// EMSCRIPTEN_END_FUNCS\n"));
  }

  if (needsBufferView(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }
  if (hasActiveSegments(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeCall(ValueBuilder::makeName("initActiveSegments"),
                             ValueBuilder::makeName(importObject)));
  }

  addTable(asmFunc[3], wasm);
  addStart(asmFunc[3], wasm);
  addExports(asmFunc[3], wasm);
  return ret;
}